

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkInterOne(Abc_Ntk_t *pNtkOn,Abc_Ntk_t *pNtkOff,int fRelation,int fVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pManOn_00;
  Aig_Man_t *pManOff_00;
  Aig_Man_t *pMan;
  Abc_Obj_t *pObj_00;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pObj;
  Aig_Man_t *pManAig;
  Aig_Man_t *pManOff;
  Aig_Man_t *pManOn;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int fRelation_local;
  Abc_Ntk_t *pNtkOff_local;
  Abc_Ntk_t *pNtkOn_local;
  
  iVar1 = Abc_NtkCoNum(pNtkOn);
  if ((iVar1 != 1) || (iVar1 = Abc_NtkCoNum(pNtkOff), iVar1 != 1)) {
    Abc_Print(1,"Currently works only for single-output networks.\n");
    return (Abc_Ntk_t *)0x0;
  }
  iVar1 = Abc_NtkCiNum(pNtkOn);
  iVar2 = Abc_NtkCiNum(pNtkOff);
  if (iVar1 != iVar2) {
    Abc_Print(1,"The number of PIs should be the same.\n");
    return (Abc_Ntk_t *)0x0;
  }
  pManOn_00 = Abc_NtkToDar(pNtkOn,0,0);
  if (pManOn_00 == (Aig_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  pManOff_00 = Abc_NtkToDar(pNtkOff,0,0);
  if (pManOff_00 == (Aig_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  pMan = Aig_ManInter(pManOn_00,pManOff_00,fRelation,fVerbose);
  if (pMan == (Aig_Man_t *)0x0) {
    Abc_Print(1,"Interpolant computation failed.\n");
    return (Abc_Ntk_t *)0x0;
  }
  Aig_ManStop(pManOn_00);
  Aig_ManStop(pManOff_00);
  if (fRelation != 0) {
    pObj_00 = Abc_NtkCreatePi(pNtkOff);
    Abc_ObjAssignName(pObj_00,"New",(char *)0x0);
  }
  pAVar3 = Abc_NtkFromDar(pNtkOff,pMan);
  Aig_ManStop(pMan);
  return pAVar3;
}

Assistant:

Abc_Ntk_t * Abc_NtkInterOne( Abc_Ntk_t * pNtkOn, Abc_Ntk_t * pNtkOff, int fRelation, int fVerbose )
{
    extern Aig_Man_t * Aig_ManInter( Aig_Man_t * pManOn, Aig_Man_t * pManOff, int fRelation, int fVerbose );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pManOn, * pManOff, * pManAig;
    if ( Abc_NtkCoNum(pNtkOn) != 1 || Abc_NtkCoNum(pNtkOff) != 1 )
    {
        Abc_Print( 1, "Currently works only for single-output networks.\n" );
        return NULL;
    }
    if ( Abc_NtkCiNum(pNtkOn) != Abc_NtkCiNum(pNtkOff) )
    {
        Abc_Print( 1, "The number of PIs should be the same.\n" );
        return NULL;
    }
    // create internal AIGs
    pManOn = Abc_NtkToDar( pNtkOn, 0, 0 );
    if ( pManOn == NULL )
        return NULL;
    pManOff = Abc_NtkToDar( pNtkOff, 0, 0 );
    if ( pManOff == NULL )
        return NULL;
    // derive the interpolant
    pManAig = Aig_ManInter( pManOn, pManOff, fRelation, fVerbose );
    if ( pManAig == NULL )
    {
        Abc_Print( 1, "Interpolant computation failed.\n" );
        return NULL;
    }
    Aig_ManStop( pManOn );
    Aig_ManStop( pManOff );
    // for the relation, add an extra input
    if ( fRelation )
    {
        Abc_Obj_t * pObj;
        pObj = Abc_NtkCreatePi( pNtkOff );
        Abc_ObjAssignName( pObj, "New", NULL );
    }
    // create logic network
    pNtkAig = Abc_NtkFromDar( pNtkOff, pManAig );
    Aig_ManStop( pManAig );
    return pNtkAig;
}